

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrome_trace_converter.cpp
# Opt level: O3

string * __thiscall
HawkTracer::client::ChromeTraceConverter::_get_args_abi_cxx11_
          (string *__return_storage_ptr__,ChromeTraceConverter *this,Event *event)

{
  size_type *psVar1;
  int iVar2;
  iterator iVar3;
  long *plVar4;
  undefined8 *puVar5;
  Value **ppVVar6;
  bool bVar7;
  long *plVar8;
  Value *pVVar9;
  undefined8 uVar10;
  long lVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Value **local_158;
  Value *local_150;
  Value *local_148;
  long lStack_140;
  string local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::core_fields_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::
                                 core_fields_abi_cxx11_);
    if (iVar2 != 0) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"thread_id","");
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"timestamp","");
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"klass_id","");
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"id","");
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"label","");
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"duration","");
      __l._M_len = 6;
      __l._M_array = &local_f0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::core_fields_abi_cxx11_,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_158,(allocator_type *)&local_110);
      lVar11 = 0;
      do {
        if (local_40 + lVar11 != *(undefined1 **)((long)local_50 + lVar11)) {
          operator_delete(*(undefined1 **)((long)local_50 + lVar11));
        }
        lVar11 = lVar11 + -0x20;
      } while (lVar11 != -0xc0);
      __cxa_atexit(std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~set,&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::
                           core_fields_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::
                           core_fields_abi_cxx11_);
    }
  }
  local_118 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_118;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  plVar8 = (long *)(this->super_Converter)._mapping_klass_name._M_dataplus._M_p;
  if (plVar8 != (long *)0x0) {
    bVar7 = true;
    do {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::core_fields_abi_cxx11_
                      ._M_t,(key_type *)(plVar8 + 1));
      if ((_Rb_tree_header *)iVar3._M_node ==
          &_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::core_fields_abi_cxx11_._M_t.
           _M_impl.super__Rb_tree_header) {
        if (!bVar7) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::operator+(&local_110,"\"",(key_type *)(plVar8 + 1));
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
        ppVVar6 = (Value **)(plVar4 + 2);
        if ((Value **)*plVar4 == ppVVar6) {
          local_148 = *ppVVar6;
          lStack_140 = plVar4[3];
          local_158 = &local_148;
        }
        else {
          local_148 = *ppVVar6;
          local_158 = (Value **)*plVar4;
        }
        local_150 = (Value *)plVar4[1];
        *plVar4 = (long)ppVVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        _get_json_value_abi_cxx11_(&local_138,(ChromeTraceConverter *)(plVar8 + 5),local_150);
        pVVar9 = (Value *)0xf;
        if (local_158 != &local_148) {
          pVVar9 = local_148;
        }
        if (pVVar9 < local_150 + local_138._M_string_length) {
          uVar10 = (Value *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            uVar10 = local_138.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < local_150 + local_138._M_string_length) goto LAB_0010f6d1;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_158);
        }
        else {
LAB_0010f6d1:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_158,(ulong)local_138._M_dataplus._M_p);
        }
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        psVar1 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_f0.field_2._M_allocated_capacity = *psVar1;
          local_f0.field_2._8_8_ = puVar5[3];
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar1;
          local_f0._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_f0._M_string_length = puVar5[1];
        *puVar5 = psVar1;
        puVar5[1] = 0;
        *(undefined1 *)psVar1 = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if (local_158 != &local_148) {
          operator_delete(local_158);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        bVar7 = false;
      }
      plVar8 = (long *)*plVar8;
    } while (plVar8 != (long *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ChromeTraceConverter::_get_args(const parser::Event& event)
{
    static std::set<std::string> core_fields = {"thread_id", "timestamp", "klass_id", "id", "label", "duration"};

    std::string ret;
    bool is_first = true;

    for (const auto& value : event.get_values())
    {
        if (core_fields.find(value.first) != core_fields.end())
        {
            continue;
        }
        if (is_first)
        {
            is_first = false;
        }
        else
        {
            ret += ",";
        }
        ret += "\"" + value.first + "\": " + _get_json_value(value.second);
    }
    return ret;
}